

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshot::removeFile(DirectorySnapshot *this,string *path)

{
  bool bVar1;
  _Self local_78;
  _Self local_70;
  iterator it;
  string local_58 [32];
  FileSystem local_38 [8];
  string name;
  string *path_local;
  DirectorySnapshot *this_local;
  
  std::__cxx11::string::string(local_58,(string *)path);
  FileSystem::fileNameFromPath(local_38,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
       ::find(&this->Files,(key_type *)local_38);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
       ::end(&this->Files);
  bVar1 = std::operator!=(&local_78,&local_70);
  if (bVar1) {
    std::
    map<std::__cxx11::string,efsw::FileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,efsw::FileInfo>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,efsw::FileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,efsw::FileInfo>>>
                        *)&this->Files,(iterator)local_70._M_node);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DirectorySnapshot::removeFile( std::string path ) {
	std::string name( FileSystem::fileNameFromPath( path ) );

	FileInfoMap::iterator it = Files.find( name );

	if ( Files.end() != it ) {
		Files.erase( it );
	}
}